

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *pNode)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  size_t __size;
  long lVar7;
  long lVar8;
  
  if (0 < (pNode->vFanouts).nSize) {
    lVar8 = 0;
    do {
      plVar2 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]];
      lVar7 = *plVar2;
      uVar3 = *(uint *)(plVar2 + 2);
      if (*(int *)(lVar7 + 0xe4) <= (int)uVar3) {
        iVar1 = *(int *)(lVar7 + 0xe0);
        iVar6 = iVar1 * 2;
        iVar5 = (int)((long)(int)uVar3 + 1);
        if ((int)uVar3 < iVar6) {
          if (iVar1 < iVar6 && iVar1 <= (int)uVar3) {
            if (*(void **)(lVar7 + 0xe8) == (void *)0x0) {
              pvVar4 = malloc((long)iVar1 << 3);
            }
            else {
              pvVar4 = realloc(*(void **)(lVar7 + 0xe8),(long)iVar1 << 3);
            }
            *(void **)(lVar7 + 0xe8) = pvVar4;
LAB_00830682:
            if (pvVar4 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *(int *)(lVar7 + 0xe0) = iVar6;
          }
        }
        else if (iVar1 <= (int)uVar3) {
          __size = ((long)(int)uVar3 + 1) * 4;
          if (*(void **)(lVar7 + 0xe8) == (void *)0x0) {
            pvVar4 = malloc(__size);
          }
          else {
            pvVar4 = realloc(*(void **)(lVar7 + 0xe8),__size);
          }
          *(void **)(lVar7 + 0xe8) = pvVar4;
          iVar6 = iVar5;
          goto LAB_00830682;
        }
        iVar1 = *(int *)(lVar7 + 0xe4);
        if (iVar1 <= (int)uVar3) {
          memset((void *)((long)iVar1 * 4 + *(long *)(lVar7 + 0xe8)),0,
                 (ulong)(uVar3 - iVar1) * 4 + 4);
        }
        *(int *)(lVar7 + 0xe4) = iVar5;
      }
      if (((int)uVar3 < 0) || (*(int *)(lVar7 + 0xe4) <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)(*(long *)(lVar7 + 0xe8) + (ulong)uVar3 * 4) == *(int *)(*plVar2 + 0xd8)) {
        uVar3 = 0xffffffff;
        if (0 < (long)*(int *)((long)plVar2 + 0x1c)) {
          lVar7 = 0;
          do {
            if (*(int *)(plVar2[4] + lVar7 * 4) == pNode->Id) {
              uVar3 = (uint)lVar7;
              break;
            }
            lVar7 = lVar7 + 1;
          } while (*(int *)((long)plVar2 + 0x1c) != lVar7);
        }
        if ((int)uVar3 < 0) {
          __assert_fail("iFanin >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                        ,0x4ec,"int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *)");
        }
        if (1 < uVar3) {
          __assert_fail("i >=0 && i < 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
        }
        if ((*(uint *)((long)plVar2 + 0x14) & (uint)(uVar3 != 0) * 0x400 + 0x400) != 0) {
          return 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pNode->vFanouts).nSize);
  }
  return 0;
}

Assistant:

int Abc_AigNodeHasComplFanoutEdgeTrav( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, iFanin;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            continue;
        iFanin = Vec_IntFind( &pFanout->vFanins, pNode->Id );
        assert( iFanin >= 0 );
        if ( Abc_ObjFaninC( pFanout, iFanin ) )
            return 1;
    }
    return 0;
}